

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linei_intersector.h
# Opt level: O3

bool embree::sse2::FlatLinearCurveMiMBIntersectorK<4,_4,_true>::occluded
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *line)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  undefined4 *puVar7;
  undefined4 *puVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  Vector *pVVar17;
  undefined4 uVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  Scene *pSVar23;
  Geometry *pGVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  ulong uVar28;
  undefined1 auVar29 [16];
  float fVar30;
  float fVar31;
  int iVar32;
  uint uVar33;
  RTCFilterFunctionN p_Var34;
  RTCRayN *pRVar35;
  long lVar36;
  ulong uVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar43;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  undefined1 auVar45 [16];
  float fVar51;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  float fVar62;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  float fVar67;
  float fVar68;
  float fVar69;
  float fVar70;
  float fVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar75;
  float fVar76;
  float fVar77;
  float fVar78;
  float fVar79;
  float fVar80;
  float fVar81;
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  LineIntersectorHitM<4> hit;
  undefined1 local_1f8 [16];
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  undefined4 uStack_1c8;
  undefined4 uStack_1c4;
  Precalculations *local_1c0;
  RTCFilterFunctionNArguments local_1b8;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_168;
  float fStack_164;
  float fStack_160;
  float fStack_15c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  uint local_138 [4];
  undefined1 local_128 [16];
  undefined8 local_118;
  undefined8 uStack_110;
  float local_108 [4];
  float local_f8 [4];
  float local_e8 [4];
  float local_d8 [4];
  float local_c8;
  float fStack_c4;
  float fStack_c0;
  float fStack_bc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined1 local_88 [16];
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  uint local_58;
  uint uStack_54;
  uint uStack_50;
  uint uStack_4c;
  uint local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  pSVar23 = context->scene;
  uVar33 = line->sharedGeomID;
  uVar19 = (line->v0).field_0.i[0];
  pGVar24 = (pSVar23->geometries).items[uVar33].ptr;
  fVar44 = pGVar24->fnumTimeSegments;
  fVar39 = (pGVar24->time_range).lower;
  fVar38 = ((*(float *)(ray + k * 4 + 0x70) - fVar39) / ((pGVar24->time_range).upper - fVar39)) *
           fVar44;
  local_1c0 = pre;
  fVar39 = floorf(fVar38);
  fVar44 = fVar44 + -1.0;
  if (fVar44 <= fVar39) {
    fVar39 = fVar44;
  }
  fVar44 = 0.0;
  if (0.0 <= fVar39) {
    fVar44 = fVar39;
  }
  lVar25 = *(long *)&pGVar24[3].time_range.upper;
  lVar36 = (long)(int)fVar44 * 0x38;
  lVar26 = *(long *)(lVar25 + lVar36);
  lVar27 = *(long *)(lVar25 + 0x10 + lVar36);
  pfVar1 = (float *)(lVar26 + lVar27 * (ulong)uVar19);
  uVar20 = (line->v0).field_0.i[1];
  pfVar2 = (float *)(lVar26 + lVar27 * (ulong)uVar20);
  uVar21 = (line->v0).field_0.i[2];
  pfVar3 = (float *)(lVar26 + lVar27 * (ulong)uVar21);
  uVar22 = (line->v0).field_0.i[3];
  pfVar4 = (float *)(lVar26 + lVar27 * (ulong)uVar22);
  lVar5 = lVar26 + lVar27 * (ulong)(uVar19 + 1);
  lVar6 = lVar26 + lVar27 * (ulong)(uVar20 + 1);
  puVar7 = (undefined4 *)(lVar26 + lVar27 * (ulong)(uVar21 + 1));
  uStack_1c8 = *puVar7;
  puVar8 = (undefined4 *)(lVar26 + lVar27 * (ulong)(uVar22 + 1));
  uStack_1c4 = *puVar8;
  lVar26 = *(long *)(lVar25 + 0x38 + lVar36);
  lVar25 = *(long *)(lVar25 + 0x48 + lVar36);
  pfVar9 = (float *)(lVar26 + (ulong)uVar19 * lVar25);
  pfVar10 = (float *)(lVar26 + (ulong)uVar20 * lVar25);
  pfVar11 = (float *)(lVar26 + (ulong)uVar21 * lVar25);
  pfVar12 = (float *)(lVar26 + (ulong)uVar22 * lVar25);
  pfVar13 = (float *)(lVar26 + (ulong)(uVar19 + 1) * lVar25);
  pfVar14 = (float *)(lVar26 + (ulong)(uVar21 + 1) * lVar25);
  fVar38 = fVar38 - fVar44;
  pfVar15 = (float *)(lVar26 + (ulong)(uVar20 + 1) * lVar25);
  pfVar16 = (float *)(lVar26 + lVar25 * (ulong)(uVar22 + 1));
  fVar65 = 1.0 - fVar38;
  local_188 = *pfVar1 * fVar65 + *pfVar9 * fVar38;
  fStack_184 = *pfVar2 * fVar65 + *pfVar10 * fVar38;
  fStack_180 = *pfVar3 * fVar65 + *pfVar11 * fVar38;
  fStack_17c = *pfVar4 * fVar65 + *pfVar12 * fVar38;
  local_168 = pfVar1[1] * fVar65 + pfVar9[1] * fVar38;
  fStack_164 = pfVar2[1] * fVar65 + pfVar10[1] * fVar38;
  fStack_160 = pfVar3[1] * fVar65 + pfVar11[1] * fVar38;
  fStack_15c = pfVar4[1] * fVar65 + pfVar12[1] * fVar38;
  local_178 = pfVar1[2] * fVar65 + pfVar9[2] * fVar38;
  fStack_174 = pfVar2[2] * fVar65 + pfVar10[2] * fVar38;
  fStack_170 = pfVar3[2] * fVar65 + pfVar11[2] * fVar38;
  fStack_16c = pfVar4[2] * fVar65 + pfVar12[2] * fVar38;
  local_148 = pfVar1[3] * fVar65 + pfVar9[3] * fVar38;
  fStack_144 = pfVar2[3] * fVar65 + pfVar10[3] * fVar38;
  fStack_140 = pfVar3[3] * fVar65 + pfVar11[3] * fVar38;
  fStack_13c = pfVar4[3] * fVar65 + pfVar12[3] * fVar38;
  fVar55 = (float)puVar7[2] * fVar65 + *pfVar13 * fVar38;
  fVar56 = (float)puVar8[2] * fVar65 + *pfVar15 * fVar38;
  fStack_1d0 = fStack_1d0 * fVar65 + *pfVar14 * fVar38;
  fStack_1cc = fStack_1cc * fVar65 + *pfVar16 * fVar38;
  _local_1d8 = CONCAT44(fVar56,fVar55);
  local_e8[0] = *(float *)(lVar5 + 4) * fVar65 + pfVar13[1] * fVar38;
  local_e8[1] = *(float *)(lVar6 + 4) * fVar65 + pfVar15[1] * fVar38;
  local_e8[2] = (float)puVar7[1] * fVar65 + pfVar14[1] * fVar38;
  local_e8[3] = (float)puVar8[1] * fVar65 + pfVar16[1] * fVar38;
  fVar40 = *(float *)(lVar5 + 8) * fVar65 + pfVar13[2] * fVar38;
  fVar43 = *(float *)(lVar6 + 8) * fVar65 + pfVar15[2] * fVar38;
  fStack_1e0 = fStack_1e0 * fVar65 + pfVar14[2] * fVar38;
  fStack_1dc = fStack_1dc * fVar65 + pfVar16[2] * fVar38;
  _local_1e8 = CONCAT44(fVar43,fVar40);
  local_138[0] = uVar33;
  local_138[1] = uVar33;
  local_138[2] = uVar33;
  local_138[3] = uVar33;
  pVVar17 = &local_1c0->ray_space[k].vy;
  fVar66 = (pVVar17->field_0).m128[0];
  fVar67 = (pVVar17->field_0).m128[1];
  local_158 = (pVVar17->field_0).m128[2];
  pVVar17 = &local_1c0->ray_space[k].vz;
  fVar68 = (pVVar17->field_0).m128[0];
  fVar51 = (pVVar17->field_0).m128[1];
  fVar30 = (pVVar17->field_0).m128[2];
  fVar44 = *(float *)(ray + k * 4 + 0x10);
  fVar39 = *(float *)(ray + k * 4 + 0x20);
  fVar73 = local_168 - fVar44;
  fVar74 = fStack_164 - fVar44;
  fVar75 = fStack_160 - fVar44;
  fVar76 = fStack_15c - fVar44;
  fVar69 = local_178 - fVar39;
  fVar70 = fStack_174 - fVar39;
  fVar71 = fStack_170 - fVar39;
  fVar72 = fStack_16c - fVar39;
  pVVar17 = &local_1c0->ray_space[k].vx;
  fVar78 = (pVVar17->field_0).m128[0];
  fVar82 = *(float *)((long)&pVVar17->field_0 + 4);
  fVar31 = *(float *)((long)&pVVar17->field_0 + 8);
  fVar77 = *(float *)(ray + k * 4);
  fVar85 = local_188 - fVar77;
  fVar86 = fStack_184 - fVar77;
  fVar87 = fStack_180 - fVar77;
  fVar88 = fStack_17c - fVar77;
  fVar57 = fVar78 * fVar85 + fVar66 * fVar73 + fVar68 * fVar69;
  fVar58 = fVar78 * fVar86 + fVar66 * fVar74 + fVar68 * fVar70;
  fVar59 = fVar78 * fVar87 + fVar66 * fVar75 + fVar68 * fVar71;
  fVar60 = fVar78 * fVar88 + fVar66 * fVar76 + fVar68 * fVar72;
  fVar61 = fVar82 * fVar85 + fVar67 * fVar73 + fVar51 * fVar69;
  fVar62 = fVar82 * fVar86 + fVar67 * fVar74 + fVar51 * fVar70;
  fVar63 = fVar82 * fVar87 + fVar67 * fVar75 + fVar51 * fVar71;
  fVar64 = fVar82 * fVar88 + fVar67 * fVar76 + fVar51 * fVar72;
  local_108[0] = fVar85 * fVar31 + fVar73 * local_158 + fVar69 * fVar30;
  local_108[1] = fVar86 * fVar31 + fVar74 * local_158 + fVar70 * fVar30;
  local_108[2] = fVar87 * fVar31 + fVar75 * local_158 + fVar71 * fVar30;
  local_108[3] = fVar88 * fVar31 + fVar76 * local_158 + fVar72 * fVar30;
  fVar75 = fVar55 - fVar77;
  fVar76 = fVar56 - fVar77;
  fVar85 = fStack_1d0 - fVar77;
  fVar77 = fStack_1cc - fVar77;
  fVar69 = local_e8[0] - fVar44;
  fVar70 = local_e8[1] - fVar44;
  fVar71 = local_e8[2] - fVar44;
  fVar44 = local_e8[3] - fVar44;
  fVar72 = fVar40 - fVar39;
  fVar73 = fVar43 - fVar39;
  fVar74 = fStack_1e0 - fVar39;
  fVar39 = fStack_1dc - fVar39;
  fVar86 = (fVar78 * fVar75 + fVar66 * fVar69 + fVar68 * fVar72) - fVar57;
  fVar87 = (fVar78 * fVar76 + fVar66 * fVar70 + fVar68 * fVar73) - fVar58;
  fVar88 = (fVar78 * fVar85 + fVar66 * fVar71 + fVar68 * fVar74) - fVar59;
  fVar78 = (fVar78 * fVar77 + fVar66 * fVar44 + fVar68 * fVar39) - fVar60;
  fVar79 = (fVar82 * fVar75 + fVar67 * fVar69 + fVar51 * fVar72) - fVar61;
  fVar80 = (fVar82 * fVar76 + fVar67 * fVar70 + fVar51 * fVar73) - fVar62;
  fVar81 = (fVar82 * fVar85 + fVar67 * fVar71 + fVar51 * fVar74) - fVar63;
  fVar82 = (fVar82 * fVar77 + fVar67 * fVar44 + fVar51 * fVar39) - fVar64;
  auVar84._0_4_ = fVar79 * fVar79;
  auVar84._4_4_ = fVar80 * fVar80;
  auVar84._8_4_ = fVar81 * fVar81;
  auVar84._12_4_ = fVar82 * fVar82;
  auVar52._0_4_ = fVar86 * fVar86 + auVar84._0_4_;
  auVar52._4_4_ = fVar87 * fVar87 + auVar84._4_4_;
  auVar52._8_4_ = fVar88 * fVar88 + auVar84._8_4_;
  auVar52._12_4_ = fVar78 * fVar78 + auVar84._12_4_;
  auVar45 = rcpps(auVar84,auVar52);
  fVar66 = auVar45._0_4_;
  fVar67 = auVar45._4_4_;
  fVar68 = auVar45._8_4_;
  fVar51 = auVar45._12_4_;
  auVar83._0_4_ =
       (((float)DAT_01f7ba10 - auVar52._0_4_ * fVar66) * fVar66 + fVar66) *
       (-fVar61 * fVar79 - fVar57 * fVar86);
  auVar83._4_4_ =
       ((DAT_01f7ba10._4_4_ - auVar52._4_4_ * fVar67) * fVar67 + fVar67) *
       (-fVar62 * fVar80 - fVar58 * fVar87);
  auVar83._8_4_ =
       ((DAT_01f7ba10._8_4_ - auVar52._8_4_ * fVar68) * fVar68 + fVar68) *
       (-fVar63 * fVar81 - fVar59 * fVar88);
  auVar83._12_4_ =
       ((DAT_01f7ba10._12_4_ - auVar52._12_4_ * fVar51) * fVar51 + fVar51) *
       (-fVar64 * fVar82 - fVar60 * fVar78);
  auVar84 = minps(auVar83,_DAT_01f7ba10);
  auVar45._0_12_ = ZEXT812(0);
  auVar45._12_4_ = 0;
  local_128 = maxps(auVar84,auVar45);
  fVar66 = local_128._0_4_;
  fVar67 = local_128._4_4_;
  fVar68 = local_128._8_4_;
  fVar51 = local_128._12_4_;
  fVar57 = fVar86 * fVar66 + fVar57;
  fVar58 = fVar87 * fVar67 + fVar58;
  fVar59 = fVar88 * fVar68 + fVar59;
  fVar60 = fVar78 * fVar51 + fVar60;
  fVar61 = fVar79 * fVar66 + fVar61;
  fVar62 = fVar80 * fVar67 + fVar62;
  fVar63 = fVar81 * fVar68 + fVar63;
  fVar64 = fVar82 * fVar51 + fVar64;
  local_108[0] = ((fVar75 * fVar31 + fVar69 * local_158 + fVar72 * fVar30) - local_108[0]) * fVar66
                 + local_108[0];
  local_108[1] = ((fVar76 * fVar31 + fVar70 * local_158 + fVar73 * fVar30) - local_108[1]) * fVar67
                 + local_108[1];
  local_108[2] = ((fVar85 * fVar31 + fVar71 * local_158 + fVar74 * fVar30) - local_108[2]) * fVar68
                 + local_108[2];
  local_108[3] = ((fVar77 * fVar31 + fVar44 * local_158 + fVar39 * fVar30) - local_108[3]) * fVar51
                 + local_108[3];
  fVar77 = ((fVar65 * *(float *)(lVar5 + 0xc) + fVar38 * pfVar13[3]) - local_148) * fVar66 +
           local_148;
  fVar66 = ((fVar65 * *(float *)(lVar6 + 0xc) + fVar38 * pfVar15[3]) - fStack_144) * fVar67 +
           fStack_144;
  fVar67 = ((fVar65 * (float)puVar7[3] + fVar38 * pfVar14[3]) - fStack_140) * fVar68 + fStack_140;
  fVar68 = ((fVar65 * (float)puVar8[3] + fVar38 * pfVar16[3]) - fStack_13c) * fVar51 + fStack_13c;
  fVar44 = *(float *)(ray + k * 4 + 0x80);
  fVar39 = *(float *)(ray + k * 4 + 0x30);
  fVar38 = *(float *)((long)local_1c0->ray_space + k * 4 + -0x10);
  auVar46._0_4_ =
       -(uint)((fVar77 + fVar77) * fVar38 < local_108[0]) &
       ~-(uint)((line->primIDs).field_0.i[0] == 0xffffffff) &
       -(uint)(local_108[0] <= fVar44 && fVar39 <= local_108[0]) &
       -(uint)(fVar57 * fVar57 + fVar61 * fVar61 <= fVar77 * fVar77);
  auVar46._4_4_ =
       -(uint)((fVar66 + fVar66) * fVar38 < local_108[1]) &
       ~-(uint)((line->primIDs).field_0.i[1] == 0xffffffff) &
       -(uint)(local_108[1] <= fVar44 && fVar39 <= local_108[1]) &
       -(uint)(fVar58 * fVar58 + fVar62 * fVar62 <= fVar66 * fVar66);
  auVar46._8_4_ =
       -(uint)((fVar67 + fVar67) * fVar38 < local_108[2]) &
       ~-(uint)((line->primIDs).field_0.i[2] == 0xffffffff) &
       -(uint)(local_108[2] <= fVar44 && fVar39 <= local_108[2]) &
       -(uint)(fVar59 * fVar59 + fVar63 * fVar63 <= fVar67 * fVar67);
  auVar46._12_4_ =
       -(uint)((fVar68 + fVar68) * fVar38 < local_108[3]) &
       ~-(uint)((line->primIDs).field_0.i[3] == 0xffffffff) &
       -(uint)(local_108[3] <= fVar44 && fVar39 <= local_108[3]) &
       -(uint)(fVar60 * fVar60 + fVar64 * fVar64 <= fVar68 * fVar68);
  iVar32 = movmskps((int)k * 0x30,auVar46);
  if (iVar32 != 0) {
    local_e8[0] = local_e8[0] - local_168;
    local_e8[1] = local_e8[1] - fStack_164;
    local_e8[2] = local_e8[2] - fStack_160;
    local_e8[3] = local_e8[3] - fStack_15c;
    auVar53._4_4_ = -(uint)(fVar56 - fStack_184 != 0.0);
    auVar53._0_4_ = -(uint)(fVar55 - local_188 != 0.0);
    auVar53._8_4_ = -(uint)(fStack_1d0 - fStack_180 != 0.0);
    auVar53._12_4_ = -(uint)(fStack_1cc - fStack_17c != 0.0);
    auVar54._4_4_ = -(uint)(local_e8[1] != 0.0);
    auVar54._0_4_ = -(uint)(local_e8[0] != 0.0);
    auVar54._8_4_ = -(uint)(local_e8[2] != 0.0);
    auVar54._12_4_ = -(uint)(local_e8[3] != 0.0);
    auVar41._4_4_ = -(uint)(fVar43 - fStack_174 != 0.0);
    auVar41._0_4_ = -(uint)(fVar40 - local_178 != 0.0);
    auVar41._8_4_ = -(uint)(fStack_1e0 - fStack_170 != 0.0);
    auVar41._12_4_ = -(uint)(fStack_1dc - fStack_16c != 0.0);
    auVar41 = auVar41 | auVar54 | auVar53;
    auVar47._0_4_ = auVar46._0_4_ & auVar41._0_4_;
    auVar47._4_4_ = auVar46._4_4_ & auVar41._4_4_;
    auVar47._8_4_ = auVar46._8_4_ & auVar41._8_4_;
    auVar47._12_4_ = auVar46._12_4_ & auVar41._12_4_;
    uVar33 = movmskps(iVar32,auVar47);
    if (uVar33 != 0) {
      local_118 = 0;
      uStack_110 = 0;
      local_f8[0] = fVar55 - local_188;
      local_f8[1] = fVar56 - fStack_184;
      local_f8[2] = fStack_1d0 - fStack_180;
      local_f8[3] = fStack_1cc - fStack_17c;
      local_d8[0] = fVar40 - local_178;
      local_d8[1] = fVar43 - fStack_174;
      local_d8[2] = fStack_1e0 - fStack_170;
      local_d8[3] = fStack_1dc - fStack_16c;
      uVar37 = (ulong)(uVar33 & 0xff);
      auVar45 = _DAT_01f7aa00;
      fStack_154 = local_158;
      fStack_150 = local_158;
      fStack_14c = local_158;
      do {
        local_1b8.hit = (RTCHitN *)&local_c8;
        local_1b8.valid = (int *)local_1f8;
        uVar28 = 0;
        if (uVar37 != 0) {
          for (; (uVar37 >> uVar28 & 1) == 0; uVar28 = uVar28 + 1) {
          }
        }
        local_68 = local_138[uVar28];
        pGVar24 = (pSVar23->geometries).items[local_68].ptr;
        if ((pGVar24->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
          if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
             (pGVar24->occlusionFilterN == (RTCFilterFunctionN)0x0)) {
            return true;
          }
          local_98 = *(undefined4 *)(local_128 + uVar28 * 4);
          uVar18 = *(undefined4 *)((long)&local_118 + uVar28 * 4);
          *(float *)(ray + k * 4 + 0x80) = local_108[uVar28];
          local_1b8.context = context->user;
          local_78 = (line->primIDs).field_0.i[uVar28];
          local_88._4_4_ = uVar18;
          local_88._0_4_ = uVar18;
          local_88._8_4_ = uVar18;
          local_88._12_4_ = uVar18;
          local_c8 = local_f8[uVar28];
          local_b8 = local_e8[uVar28];
          local_a8 = local_d8[uVar28];
          fStack_c4 = local_c8;
          fStack_c0 = local_c8;
          fStack_bc = local_c8;
          fStack_b4 = local_b8;
          fStack_b0 = local_b8;
          fStack_ac = local_b8;
          fStack_a4 = local_a8;
          fStack_a0 = local_a8;
          fStack_9c = local_a8;
          uStack_94 = local_98;
          uStack_90 = local_98;
          uStack_8c = local_98;
          uStack_74 = local_78;
          uStack_70 = local_78;
          uStack_6c = local_78;
          uStack_64 = local_68;
          uStack_60 = local_68;
          uStack_5c = local_68;
          local_58 = (local_1b8.context)->instID[0];
          uStack_54 = local_58;
          uStack_50 = local_58;
          uStack_4c = local_58;
          local_48 = (local_1b8.context)->instPrimID[0];
          uStack_44 = local_48;
          uStack_40 = local_48;
          uStack_3c = local_48;
          local_1f8 = *(undefined1 (*) [16])
                       (mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
          local_1b8.geometryUserPtr = pGVar24->userPtr;
          local_1b8.N = 4;
          p_Var34 = pGVar24->occlusionFilterN;
          local_1b8.ray = (RTCRayN *)ray;
          if (p_Var34 != (RTCFilterFunctionN)0x0) {
            p_Var34 = (RTCFilterFunctionN)(*p_Var34)(&local_1b8);
            auVar45 = _DAT_01f7aa00;
          }
          auVar48._0_4_ = -(uint)(local_1f8._0_4_ == 0);
          auVar48._4_4_ = -(uint)(local_1f8._4_4_ == 0);
          auVar48._8_4_ = -(uint)(local_1f8._8_4_ == 0);
          auVar48._12_4_ = -(uint)(local_1f8._12_4_ == 0);
          uVar33 = movmskps((int)p_Var34,auVar48);
          pRVar35 = (RTCRayN *)(ulong)(uVar33 ^ 0xf);
          if ((uVar33 ^ 0xf) == 0) {
            auVar29._8_4_ = 0xffffffff;
            auVar29._0_8_ = 0xffffffffffffffff;
            auVar29._12_4_ = 0xffffffff;
            auVar49 = auVar48 ^ auVar29;
          }
          else {
            p_Var34 = context->args->filter;
            if ((p_Var34 != (RTCFilterFunctionN)0x0) &&
               (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                 RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar24->field_8).field_0x2 & 0x40) != 0)))) {
              (*p_Var34)(&local_1b8);
              auVar45 = _DAT_01f7aa00;
            }
            auVar42._0_4_ = -(uint)(local_1f8._0_4_ == 0);
            auVar42._4_4_ = -(uint)(local_1f8._4_4_ == 0);
            auVar42._8_4_ = -(uint)(local_1f8._8_4_ == 0);
            auVar42._12_4_ = -(uint)(local_1f8._12_4_ == 0);
            auVar49._8_4_ = 0xffffffff;
            auVar49._0_8_ = 0xffffffffffffffff;
            auVar49._12_4_ = 0xffffffff;
            auVar49 = auVar42 ^ auVar49;
            *(undefined1 (*) [16])(local_1b8.ray + 0x80) =
                 ~auVar42 & auVar45 | *(undefined1 (*) [16])(local_1b8.ray + 0x80) & auVar42;
            pRVar35 = local_1b8.ray;
          }
          auVar50._0_4_ = auVar49._0_4_ << 0x1f;
          auVar50._4_4_ = auVar49._4_4_ << 0x1f;
          auVar50._8_4_ = auVar49._8_4_ << 0x1f;
          auVar50._12_4_ = auVar49._12_4_ << 0x1f;
          iVar32 = movmskps((int)pRVar35,auVar50);
          if (iVar32 != 0) {
            return true;
          }
          *(float *)(ray + k * 4 + 0x80) = fVar44;
        }
        uVar37 = uVar37 ^ 1L << (uVar28 & 0x3f);
      } while (uVar37 != 0);
    }
  }
  return false;
}

Assistant:

static __forceinline bool occluded(const Precalculations& pre, RayK<K>& ray, size_t k, RayQueryContext* context, const Primitive& line)
      {
        STAT3(shadow.trav_prims,1,1,1);
        const LineSegments* geom = context->scene->get<LineSegments>(line.geomID());
        Vec4vf<M> v0,v1; line.gather(v0,v1,geom,ray.time()[k]);
        const vbool<M> valid = line.valid();
        return FlatLinearCurveIntersectorK<M,K>::intersect(valid,ray,k,context,geom,pre,v0,v1,Occluded1KEpilogM<M,K,filter>(ray,k,context,line.geomID(),line.primID()));
      }